

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::RandomBernoulliDynamicLayerParams::SharedCtor
          (RandomBernoulliDynamicLayerParams *this)

{
  this->seed_ = 0;
  this->prob_ = 0.0;
  this->_cached_size_ = 0;
  return;
}

Assistant:

void RandomBernoulliDynamicLayerParams::SharedCtor() {
  ::memset(&seed_, 0, reinterpret_cast<char*>(&prob_) -
    reinterpret_cast<char*>(&seed_) + sizeof(prob_));
  _cached_size_ = 0;
}